

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

void __thiscall
minja::Parser::Parser
          (Parser *this,
          shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *template_str,Options *options)

{
  element_type *peVar1;
  pointer pcVar2;
  bool bVar3;
  runtime_error *this_00;
  
  std::
  __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)this,&template_str->
                          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  (this->it)._M_current = (char *)0x0;
  (this->start)._M_current = (char *)0x0;
  (this->end)._M_current = (char *)0x0;
  (this->options).keep_trailing_newline = options->keep_trailing_newline;
  bVar3 = options->lstrip_blocks;
  (this->options).trim_blocks = options->trim_blocks;
  (this->options).lstrip_blocks = bVar3;
  if ((template_str->
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr != (element_type *)0x0) {
    peVar1 = (this->template_str).
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    pcVar2 = (peVar1->_M_dataplus)._M_p;
    (this->it)._M_current = pcVar2;
    (this->start)._M_current = pcVar2;
    (this->end)._M_current = (peVar1->_M_dataplus)._M_p + peVar1->_M_string_length;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Template string is null");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Parser(const std::shared_ptr<std::string>& template_str, const Options & options) : template_str(template_str), options(options) {
      if (!template_str) throw std::runtime_error("Template string is null");
      start = it = this->template_str->begin();
      end = this->template_str->end();
    }